

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void leveldb::anon_unknown_35::CleanupIteratorState(void *arg1,void *arg2)

{
  IterState *state;
  void *arg2_local;
  void *arg1_local;
  
  port::Mutex::Lock(*arg1);
  MemTable::Unref(*(MemTable **)((long)arg1 + 0x10));
  if (*(long *)((long)arg1 + 0x18) != 0) {
    MemTable::Unref(*(MemTable **)((long)arg1 + 0x18));
  }
  Version::Unref(*(Version **)((long)arg1 + 8));
  port::Mutex::Unlock(*arg1);
  if (arg1 != (void *)0x0) {
    operator_delete(arg1);
  }
  return;
}

Assistant:

static void CleanupIteratorState(void *arg1, void *arg2) {
  IterState *state = reinterpret_cast<IterState *>(arg1);
  state->mu->Lock();
  state->mem->Unref();
  if (state->imm!=NULL) state->imm->Unref();
  state->version->Unref();
  state->mu->Unlock();
  delete state;
}